

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QPointer<QAbstractItemDelegate> __thiscall
QMap<int,_QPointer<QAbstractItemDelegate>_>::value
          (QMap<int,_QPointer<QAbstractItemDelegate>_> *this,int *key,
          QPointer<QAbstractItemDelegate> *defaultValue)

{
  bool bVar1;
  QObject *extraout_RDX;
  QObject *extraout_RDX_00;
  QObject *extraout_RDX_01;
  QObject *pQVar2;
  Data *in_RDI;
  long in_FS_OFFSET;
  QPointer<QAbstractItemDelegate> QVar3;
  const_iterator i;
  map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
  *in_stack_ffffffffffffffa8;
  Data *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
                      *)0x816b36);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
                  *)0x816b64);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x816b75);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_>
                  *)0x816b84);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>::
      operator->((_Rb_tree_const_iterator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_> *
                 )0x816bb4);
      QPointer<QAbstractItemDelegate>::QPointer
                ((QPointer<QAbstractItemDelegate> *)this_00,
                 (QPointer<QAbstractItemDelegate> *)in_stack_ffffffffffffffa8);
      pQVar2 = extraout_RDX_00;
    }
    else {
      QPointer<QAbstractItemDelegate>::QPointer
                ((QPointer<QAbstractItemDelegate> *)this_00,
                 (QPointer<QAbstractItemDelegate> *)in_stack_ffffffffffffffa8);
      pQVar2 = extraout_RDX_01;
    }
  }
  else {
    QPointer<QAbstractItemDelegate>::QPointer
              ((QPointer<QAbstractItemDelegate> *)this_00,
               (QPointer<QAbstractItemDelegate> *)in_stack_ffffffffffffffa8);
    pQVar2 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar3.wp.value = pQVar2;
    QVar3.wp.d = in_RDI;
    return (QPointer<QAbstractItemDelegate>)QVar3.wp;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }